

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall icu_63::UnifiedCache::_runEvictionSlice(UnifiedCache *this)

{
  SharedObject *value;
  UBool UVar1;
  UHashElement *element_00;
  SharedObject *sharedObject;
  UHashElement *element;
  int32_t i;
  int32_t maxItemsToEvict;
  UnifiedCache *this_local;
  
  element._4_4_ = _computeCountOfItemsToEvict(this);
  if (0 < element._4_4_) {
    element._0_4_ = 0;
    while (((int)element < 10 &&
           (element_00 = _nextElement(this), element_00 != (UHashElement *)0x0))) {
      UVar1 = _isEvictable(this,element_00);
      if (UVar1 != '\0') {
        value = (SharedObject *)(element_00->value).pointer;
        uhash_removeElement_63(this->fHashtable,element_00);
        removeSoftRef(this,value);
        this->fAutoEvictedCount = this->fAutoEvictedCount + 1;
        element._4_4_ = element._4_4_ + -1;
        if (element._4_4_ == 0) {
          return;
        }
      }
      element._0_4_ = (int)element + 1;
    }
  }
  return;
}

Assistant:

void UnifiedCache::_runEvictionSlice() const {
    int32_t maxItemsToEvict = _computeCountOfItemsToEvict();
    if (maxItemsToEvict <= 0) {
        return;
    }
    for (int32_t i = 0; i < MAX_EVICT_ITERATIONS; ++i) {
        const UHashElement *element = _nextElement();
        if (element == nullptr) {
            break;
        }
        if (_isEvictable(element)) {
            const SharedObject *sharedObject =
                    (const SharedObject *) element->value.pointer;
            uhash_removeElement(fHashtable, element);
            removeSoftRef(sharedObject);   // Deletes sharedObject when SoftRefCount goes to zero.
            ++fAutoEvictedCount;
            if (--maxItemsToEvict == 0) {
                break;
            }
        }
    }
}